

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshints.c
# Opt level: O2

void cf2_glyphpath_pushPrevElem
               (CF2_GlyphPath glyphpath,CF2_HintMap hintmap,FT_Vector *nextP0,FT_Vector nextP1,
               FT_Bool close)

{
  ulong uVar1;
  FT_Pos FVar2;
  FT_Vector *pFVar3;
  int iVar4;
  FT_Long FVar5;
  int iVar6;
  int iVar7;
  CF2_F16Dot16 CVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  CF2_HintMap hintmap_00;
  CF2_F16Dot16 CVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  FT_Vector *pFVar18;
  bool bVar19;
  FT_Pos local_a0;
  CF2_CallbackParamsRec params;
  
  bVar19 = glyphpath->prevElemOp != 2;
  pFVar18 = &glyphpath->prevElemP3;
  pFVar3 = &glyphpath->prevElemP2;
  if (!bVar19) {
    pFVar18 = &glyphpath->prevElemP1;
    pFVar3 = &glyphpath->prevElemP0;
  }
  uVar1 = (ulong)bVar19;
  lVar15 = (&glyphpath->prevElemP1)[uVar1 * 2].x;
  if (pFVar18->y == nextP0->y && lVar15 == nextP0->x) {
LAB_001f98fe:
    local_a0 = 0;
    lVar15 = 0;
    bVar19 = true;
  }
  else {
    iVar6 = (int)(&glyphpath->prevElemP0)[uVar1 * 2].x;
    iVar7 = (int)pFVar3->y;
    iVar9 = (int)nextP0->x;
    iVar4 = (int)nextP0->y;
    lVar14 = (long)(((int)nextP1.y - iVar4) + 0x10 >> 5);
    lVar12 = (((int)lVar15 - iVar6) + 0x10 >> 5) * lVar14;
    lVar15 = (long)(((int)nextP1.x - iVar9) + 0x10 >> 5);
    lVar17 = (((int)pFVar18->y - iVar7) + 0x10 >> 5) * lVar15;
    iVar11 = (int)((ulong)(lVar12 + 0x8000 + (lVar12 >> 0x3f)) >> 0x10);
    iVar16 = (int)((ulong)(lVar17 + 0x8000 + (lVar17 >> 0x3f)) >> 0x10);
    if (iVar11 == iVar16) goto LAB_001f98fe;
    uVar10 = uVar1 * 0x20 | 0x4988;
    lVar14 = lVar14 * ((iVar9 - iVar6) + 0x10 >> 5);
    lVar15 = ((iVar4 - iVar7) + 0x10 >> 5) * lVar15;
    FVar5 = FT_DivFix((long)((int)((ulong)(lVar14 + 0x8000 + (lVar14 >> 0x3f)) >> 0x10) -
                            (int)((ulong)(lVar15 + 0x8000 + (lVar15 >> 0x3f)) >> 0x10)),
                      (long)(iVar11 - iVar16));
    lVar15 = (&glyphpath->prevElemP0)[uVar1 * 2].x;
    lVar12 = *(long *)((long)(glyphpath->hintMap).edge + (uVar10 - 0x38));
    iVar4 = (int)lVar12;
    lVar14 = (long)(iVar4 - (int)lVar15) * (long)(int)FVar5;
    iVar6 = (int)((ulong)(lVar14 + 0x8000 + (lVar14 >> 0x3f)) >> 0x10);
    local_a0 = (FT_Pos)(iVar6 + (int)lVar15);
    lVar14 = pFVar3->y;
    iVar9 = (int)pFVar18->y;
    lVar17 = (long)(iVar9 - (int)lVar14) * (long)(int)FVar5;
    iVar7 = (int)((ulong)(lVar17 + 0x8000 + (lVar17 >> 0x3f)) >> 0x10);
    if (lVar12 == lVar15) {
      iVar11 = -iVar6;
      if (0 < iVar6) {
        iVar11 = iVar6;
      }
      if (iVar11 < glyphpath->snapThreshold) {
        local_a0 = lVar15;
      }
    }
    lVar15 = (long)(iVar7 + (int)lVar14);
    if (pFVar18->y == lVar14) {
      iVar6 = -iVar7;
      if (0 < iVar7) {
        iVar6 = iVar7;
      }
      if (iVar6 < glyphpath->snapThreshold) {
        lVar15 = lVar14;
      }
    }
    if (nextP0->x == nextP1.x) {
      iVar7 = (int)local_a0 - (int)nextP1.x;
      iVar6 = -iVar7;
      if (0 < iVar7) {
        iVar6 = iVar7;
      }
      if (iVar6 < glyphpath->snapThreshold) {
        local_a0 = nextP1.x;
      }
    }
    if (nextP0->y == nextP1.y) {
      iVar7 = (int)lVar15 - (int)nextP1.y;
      iVar6 = -iVar7;
      if (0 < iVar7) {
        iVar6 = iVar7;
      }
      if (iVar6 < glyphpath->snapThreshold) {
        lVar15 = nextP1.y;
      }
    }
    lVar14 = local_a0 - ((int)nextP0->x + iVar4) / 2;
    lVar12 = lVar14 * -0x100000000 >> 0x20;
    if (-1 < lVar14) {
      lVar12 = lVar14;
    }
    if (glyphpath->miterLimit < lVar12) {
      bVar19 = true;
    }
    else {
      lVar14 = lVar15 - ((int)nextP0->y + iVar9) / 2;
      lVar12 = lVar14 * -0x100000000 >> 0x20;
      if (-1 < lVar14) {
        lVar12 = lVar14;
      }
      if (glyphpath->miterLimit < lVar12) {
        bVar19 = true;
      }
      else {
        *(FT_Pos *)((long)(glyphpath->hintMap).edge + (uVar10 - 0x38)) = local_a0;
        pFVar18->y = lVar15;
        bVar19 = false;
      }
    }
  }
  pFVar3 = &glyphpath->currentDS;
  params.pt0.x = (glyphpath->currentDS).x;
  params.pt0.y = (glyphpath->currentDS).y;
  if (glyphpath->prevElemOp == 4) {
    params.op = 4;
    cf2_glyphpath_hintPoint
              (glyphpath,hintmap,&params.pt1,(CF2_F16Dot16)(glyphpath->prevElemP1).x,
               (CF2_F16Dot16)(glyphpath->prevElemP1).y);
    cf2_glyphpath_hintPoint
              (glyphpath,hintmap,&params.pt2,(CF2_F16Dot16)(glyphpath->prevElemP2).x,
               (CF2_F16Dot16)(glyphpath->prevElemP2).y);
    pFVar18 = &params.pt3;
    cf2_glyphpath_hintPoint
              (glyphpath,hintmap,pFVar18,(CF2_F16Dot16)(glyphpath->prevElemP3).x,
               (CF2_F16Dot16)(glyphpath->prevElemP3).y);
    lVar12 = 0x18;
  }
  else {
    if (glyphpath->prevElemOp != 2) goto LAB_001f9be4;
    params.op = 2;
    if (close == '\0') {
      CVar8 = (CF2_F16Dot16)(glyphpath->prevElemP1).x;
      CVar13 = (CF2_F16Dot16)(glyphpath->prevElemP1).y;
      hintmap_00 = hintmap;
    }
    else {
      CVar8 = (CF2_F16Dot16)(glyphpath->prevElemP1).x;
      CVar13 = (CF2_F16Dot16)(glyphpath->prevElemP1).y;
      hintmap_00 = &glyphpath->firstHintMap;
    }
    cf2_glyphpath_hintPoint(glyphpath,hintmap_00,&params.pt1,CVar8,CVar13);
    pFVar18 = &params.pt1;
    lVar12 = 8;
    if ((params.pt0.x == params.pt1.x) && (params.pt0.y == params.pt1.y)) goto LAB_001f9be4;
  }
  (**(code **)((long)&glyphpath->callbacks->moveTo + lVar12))(glyphpath->callbacks,&params);
  FVar2 = pFVar18->y;
  pFVar3->x = pFVar18->x;
  (glyphpath->currentDS).y = FVar2;
LAB_001f9be4:
  if (!(bool)(close == '\0' & (bVar19 ^ 1U))) {
    if (close == '\0') {
      CVar8 = (CF2_F16Dot16)nextP0->x;
      CVar13 = (CF2_F16Dot16)nextP0->y;
    }
    else {
      hintmap = &glyphpath->firstHintMap;
      CVar8 = (CF2_F16Dot16)nextP0->x;
      CVar13 = (CF2_F16Dot16)nextP0->y;
    }
    cf2_glyphpath_hintPoint(glyphpath,hintmap,&params.pt1,CVar8,CVar13);
    if ((params.pt1.x != pFVar3->x) || (params.pt1.y != (glyphpath->currentDS).y)) {
      params.op = 2;
      params.pt0.x = pFVar3->x;
      params.pt0.y = (glyphpath->currentDS).y;
      (*glyphpath->callbacks->lineTo)(glyphpath->callbacks,&params);
      pFVar3->x = params.pt1.x;
      (glyphpath->currentDS).y = params.pt1.y;
    }
  }
  if (!bVar19) {
    nextP0->x = local_a0;
    nextP0->y = lVar15;
  }
  return;
}

Assistant:

static void
  cf2_glyphpath_pushPrevElem( CF2_GlyphPath  glyphpath,
                              CF2_HintMap    hintmap,
                              FT_Vector*     nextP0,
                              FT_Vector      nextP1,
                              FT_Bool        close )
  {
    CF2_CallbackParamsRec  params;

    FT_Vector*  prevP0;
    FT_Vector*  prevP1;

    FT_Vector  intersection    = { 0, 0 };
    FT_Bool    useIntersection = FALSE;


    FT_ASSERT( glyphpath->prevElemOp == CF2_PathOpLineTo ||
               glyphpath->prevElemOp == CF2_PathOpCubeTo );

    if ( glyphpath->prevElemOp == CF2_PathOpLineTo )
    {
      prevP0 = &glyphpath->prevElemP0;
      prevP1 = &glyphpath->prevElemP1;
    }
    else
    {
      prevP0 = &glyphpath->prevElemP2;
      prevP1 = &glyphpath->prevElemP3;
    }

    /* optimization: if previous and next elements are offset by the same */
    /* amount, then there will be no gap, and no need to compute an       */
    /* intersection.                                                      */
    if ( prevP1->x != nextP0->x || prevP1->y != nextP0->y )
    {
      /* previous element does not join next element:             */
      /* adjust end point of previous element to the intersection */
      useIntersection = cf2_glyphpath_computeIntersection( glyphpath,
                                                           prevP0,
                                                           prevP1,
                                                           nextP0,
                                                           &nextP1,
                                                           &intersection );
      if ( useIntersection )
      {
        /* modify the last point of the cached element (either line or */
        /* curve)                                                      */
        *prevP1 = intersection;
      }
    }

    params.pt0 = glyphpath->currentDS;

    switch( glyphpath->prevElemOp )
    {
    case CF2_PathOpLineTo:
      params.op = CF2_PathOpLineTo;

      /* note: pt2 and pt3 are unused */

      if ( close )
      {
        /* use first hint map if closing */
        cf2_glyphpath_hintPoint( glyphpath,
                                 &glyphpath->firstHintMap,
                                 &params.pt1,
                                 glyphpath->prevElemP1.x,
                                 glyphpath->prevElemP1.y );
      }
      else
      {
        cf2_glyphpath_hintPoint( glyphpath,
                                 hintmap,
                                 &params.pt1,
                                 glyphpath->prevElemP1.x,
                                 glyphpath->prevElemP1.y );
      }

      /* output only non-zero length lines */
      if ( params.pt0.x != params.pt1.x || params.pt0.y != params.pt1.y )
      {
        glyphpath->callbacks->lineTo( glyphpath->callbacks, &params );

        glyphpath->currentDS = params.pt1;
      }
      break;

    case CF2_PathOpCubeTo:
      params.op = CF2_PathOpCubeTo;

      /* TODO: should we intersect the interior joins (p1-p2 and p2-p3)? */
      cf2_glyphpath_hintPoint( glyphpath,
                               hintmap,
                               &params.pt1,
                               glyphpath->prevElemP1.x,
                               glyphpath->prevElemP1.y );
      cf2_glyphpath_hintPoint( glyphpath,
                               hintmap,
                               &params.pt2,
                               glyphpath->prevElemP2.x,
                               glyphpath->prevElemP2.y );
      cf2_glyphpath_hintPoint( glyphpath,
                               hintmap,
                               &params.pt3,
                               glyphpath->prevElemP3.x,
                               glyphpath->prevElemP3.y );

      glyphpath->callbacks->cubeTo( glyphpath->callbacks, &params );

      glyphpath->currentDS = params.pt3;

      break;
    }

    if ( !useIntersection || close )
    {
      /* insert connecting line between end of previous element and start */
      /* of current one                                                   */
      /* note: at the end of a subpath, we might do both, so use `nextP0' */
      /* before we change it, below                                       */

      if ( close )
      {
        /* if we are closing the subpath, then nextP0 is in the first     */
        /* hint zone                                                      */
        cf2_glyphpath_hintPoint( glyphpath,
                                 &glyphpath->firstHintMap,
                                 &params.pt1,
                                 nextP0->x,
                                 nextP0->y );
      }
      else
      {
        cf2_glyphpath_hintPoint( glyphpath,
                                 hintmap,
                                 &params.pt1,
                                 nextP0->x,
                                 nextP0->y );
      }

      if ( params.pt1.x != glyphpath->currentDS.x ||
           params.pt1.y != glyphpath->currentDS.y )
      {
        /* length is nonzero */
        params.op  = CF2_PathOpLineTo;
        params.pt0 = glyphpath->currentDS;

        /* note: pt2 and pt3 are unused */
        glyphpath->callbacks->lineTo( glyphpath->callbacks, &params );

        glyphpath->currentDS = params.pt1;
      }
    }

    if ( useIntersection )
    {
      /* return intersection point to caller */
      *nextP0 = intersection;
    }
  }